

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::AbstractDOMParser::notationDecl
          (AbstractDOMParser *this,XMLNotationDecl *notDecl,bool param_2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar4;
  XMLCh *chars;
  XMLSize_t XVar5;
  XMLCh *chars_00;
  XMLSize_t XVar6;
  undefined7 in_register_00000011;
  XMLBuffer *pXVar7;
  XMLBuffer *pXVar8;
  long *plVar3;
  
  iVar2 = (*(this->fDocument->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x3c])
                    (this->fDocument,notDecl->fName,CONCAT71(in_register_00000011,param_2));
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  (**(code **)(*plVar3 + 0x160))(plVar3,notDecl->fPublicId);
  (**(code **)(*plVar3 + 0x168))(plVar3,notDecl->fSystemId);
  (**(code **)(*plVar3 + 0x170))(plVar3,notDecl->fBaseURI);
  iVar2 = (*(this->fDocumentType->super_DOMDocumentType).super_DOMNode._vptr_DOMNode[0x2a])();
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
                             ((long *)CONCAT44(extraout_var_00,iVar2),plVar3);
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x138))(plVar4);
  }
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if (bVar1) {
    pXVar8 = this->fInternalSubset;
    XVar6 = pXVar8->fIndex;
    XVar5 = pXVar8->fCapacity;
    pXVar7 = pXVar8;
    if (XVar6 == XVar5) {
      XMLBuffer::ensureCapacity(pXVar8,1);
      XVar6 = pXVar8->fIndex;
      pXVar7 = this->fInternalSubset;
      XVar5 = pXVar7->fCapacity;
    }
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L'<';
    XVar6 = pXVar7->fIndex;
    pXVar8 = pXVar7;
    if (XVar6 == XVar5) {
      XMLBuffer::ensureCapacity(pXVar7,1);
      XVar6 = pXVar7->fIndex;
      pXVar8 = this->fInternalSubset;
    }
    pXVar7->fIndex = XVar6 + 1;
    pXVar7->fBuffer[XVar6] = L'!';
    XMLBuffer::append(pXVar8,L"NOTATION");
    pXVar8 = this->fInternalSubset;
    XVar6 = pXVar8->fIndex;
    pXVar7 = pXVar8;
    if (XVar6 == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
      XVar6 = pXVar8->fIndex;
      pXVar7 = this->fInternalSubset;
    }
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L' ';
    XMLBuffer::append(pXVar7,notDecl->fName);
    chars = (XMLCh *)(**(code **)(*plVar3 + 0x140))(plVar3);
    if (chars != (XMLCh *)0x0) {
      pXVar8 = this->fInternalSubset;
      XVar6 = pXVar8->fIndex;
      pXVar7 = pXVar8;
      if (XVar6 == pXVar8->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar6 = pXVar8->fIndex;
        pXVar7 = this->fInternalSubset;
      }
      pXVar8->fIndex = XVar6 + 1;
      pXVar8->fBuffer[XVar6] = L' ';
      XMLBuffer::append(pXVar7,(XMLCh *)XMLUni::fgPubIDString);
      pXVar8 = this->fInternalSubset;
      XVar6 = pXVar8->fIndex;
      XVar5 = pXVar8->fCapacity;
      pXVar7 = pXVar8;
      if (XVar6 == XVar5) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar6 = pXVar8->fIndex;
        pXVar7 = this->fInternalSubset;
        XVar5 = pXVar7->fCapacity;
      }
      pXVar8->fIndex = XVar6 + 1;
      pXVar8->fBuffer[XVar6] = L' ';
      XVar6 = pXVar7->fIndex;
      pXVar8 = pXVar7;
      if (XVar6 == XVar5) {
        XMLBuffer::ensureCapacity(pXVar7,1);
        XVar6 = pXVar7->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar7->fIndex = XVar6 + 1;
      pXVar7->fBuffer[XVar6] = L'\"';
      XMLBuffer::append(pXVar8,chars);
      pXVar8 = this->fInternalSubset;
      XVar6 = pXVar8->fIndex;
      if (XVar6 == pXVar8->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar6 = pXVar8->fIndex;
      }
      pXVar8->fIndex = XVar6 + 1;
      pXVar8->fBuffer[XVar6] = L'\"';
    }
    chars_00 = (XMLCh *)(**(code **)(*plVar3 + 0x148))(plVar3);
    pXVar8 = this->fInternalSubset;
    if (chars_00 != (XMLCh *)0x0) {
      XVar6 = pXVar8->fIndex;
      pXVar7 = pXVar8;
      if (XVar6 == pXVar8->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar8,1);
        XVar6 = pXVar8->fIndex;
        pXVar7 = this->fInternalSubset;
      }
      pXVar8->fIndex = XVar6 + 1;
      pXVar8->fBuffer[XVar6] = L' ';
      if (chars == (XMLCh *)0x0) {
        XMLBuffer::append(pXVar7,(XMLCh *)XMLUni::fgSysIDString);
        pXVar8 = this->fInternalSubset;
        XVar6 = pXVar8->fIndex;
        pXVar7 = pXVar8;
        if (XVar6 == pXVar8->fCapacity) {
          XMLBuffer::ensureCapacity(pXVar8,1);
          XVar6 = pXVar8->fIndex;
          pXVar7 = this->fInternalSubset;
        }
        pXVar8->fIndex = XVar6 + 1;
        pXVar8->fBuffer[XVar6] = L' ';
      }
      XVar6 = pXVar7->fIndex;
      pXVar8 = pXVar7;
      if (XVar6 == pXVar7->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar7,1);
        XVar6 = pXVar7->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar7->fIndex = XVar6 + 1;
      pXVar7->fBuffer[XVar6] = L'\"';
      XMLBuffer::append(pXVar8,chars_00);
      pXVar7 = this->fInternalSubset;
      XVar6 = pXVar7->fIndex;
      pXVar8 = pXVar7;
      if (XVar6 == pXVar7->fCapacity) {
        XMLBuffer::ensureCapacity(pXVar7,1);
        XVar6 = pXVar7->fIndex;
        pXVar8 = this->fInternalSubset;
      }
      pXVar7->fIndex = XVar6 + 1;
      pXVar7->fBuffer[XVar6] = L'\"';
    }
    XVar6 = pXVar8->fIndex;
    if (XVar6 == pXVar8->fCapacity) {
      XMLBuffer::ensureCapacity(pXVar8,1);
      XVar6 = pXVar8->fIndex;
    }
    pXVar8->fIndex = XVar6 + 1;
    pXVar8->fBuffer[XVar6] = L'>';
  }
  return;
}

Assistant:

void AbstractDOMParser::notationDecl
(
    const   XMLNotationDecl&    notDecl
    , const bool
)
{
    DOMNotationImpl* notation = (DOMNotationImpl *)fDocument->createNotation(notDecl.getName());
    notation->setPublicId(notDecl.getPublicId());
    notation->setSystemId(notDecl.getSystemId());
    notation->setBaseURI(notDecl.getBaseURI());

    DOMNode* rem = fDocumentType->getNotations()->setNamedItem( notation );
    if (rem)
        rem->release();

    if (fDocumentType->isIntSubsetReading())
    {
        //add thes chars to internalSubset variable
        fInternalSubset.append(chOpenAngle);
        fInternalSubset.append(chBang);
        fInternalSubset.append(XMLUni::fgNotationString);
        fInternalSubset.append(chSpace);

        fInternalSubset.append(notDecl.getName());

        bool publicKeywordPrinted = false;

        const XMLCh* id = notation->getPublicId();
        if (id != 0) {
            fInternalSubset.append(chSpace);
            fInternalSubset.append(XMLUni::fgPubIDString);
            fInternalSubset.append(chSpace);
            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);

            publicKeywordPrinted = true;
        }
        id = notation->getSystemId();
        if (id != 0) {
            fInternalSubset.append(chSpace);

            if ( !publicKeywordPrinted ){
				fInternalSubset.append(XMLUni::fgSysIDString);
				fInternalSubset.append(chSpace);
			}

            fInternalSubset.append(chDoubleQuote);
            fInternalSubset.append(id);
            fInternalSubset.append(chDoubleQuote);
        }
        fInternalSubset.append(chCloseAngle);
    }
}